

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimPatWrite(char *pFileName,Vec_Wrd_t *vSimsIn,int nWords)

{
  int nWords_local;
  Vec_Wrd_t *vSimsIn_local;
  char *pFileName_local;
  
  Vec_WrdDumpHex(pFileName,vSimsIn,nWords,0);
  return;
}

Assistant:

void Gia_ManSimPatWrite( char * pFileName, Vec_Wrd_t * vSimsIn, int nWords )
{
    Vec_WrdDumpHex( pFileName, vSimsIn, nWords, 0 );
}